

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O1

void __thiscall gvr::CameraCollection::loadCamera(CameraCollection *this,char *file)

{
  int iVar1;
  long lVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined1 auVar3 [16];
  double t;
  double dmin;
  double doffs;
  Properties prop_1;
  double dmax;
  Properties mprop;
  string s;
  string name;
  Matrix33d A;
  PinholeCamera cam;
  Properties prop;
  double local_378;
  double local_370;
  double local_368;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  double local_330;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  SMatrix<double,_3,_3> local_2b8;
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  code *local_248;
  string local_240 [8];
  undefined1 local_238 [256];
  long *local_138;
  undefined1 local_130 [8];
  double local_128;
  _Base_ptr ap_Stack_120 [32];
  long *local_20;
  long lVar4;
  
  std::__cxx11::string::string((string *)local_2d8,file,(allocator *)&local_248);
  lVar2 = std::__cxx11::string::find_last_of((char *)local_2d8,0x128b1c,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_248,(ulong)local_2d8);
    std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_248);
    if (local_248 != (code *)local_238) {
      operator_delete(local_248);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)local_2d8);
  if (iVar1 == 0) {
    gutil::Properties::Properties((Properties *)&local_328,file);
    local_360._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_360._M_impl.super__Rb_tree_header._M_header;
    local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lVar2 = 0;
    local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2b8.v[2][2] = 0.0;
    local_2b8.v[2][0] = 0.0;
    local_2b8.v[2][1] = 0.0;
    local_2b8.v[1][1] = 0.0;
    local_2b8.v[1][2] = 0.0;
    local_2b8.v[0][2] = 0.0;
    local_2b8.v[1][0] = 0.0;
    local_2b8.v[0][0] = 0.0;
    local_2b8.v[0][1] = 0.0;
    auVar3 = _DAT_00128690;
    do {
      if (SUB164(auVar3 ^ _DAT_001286a0,4) == -0x80000000 &&
          SUB164(auVar3 ^ _DAT_001286a0,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_2b8.v[0] + lVar2) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_2b8.v[1] + lVar2 + 8) = 0x3ff0000000000000;
      }
      lVar4 = auVar3._8_8_;
      auVar3._0_8_ = auVar3._0_8_ + 2;
      auVar3._8_8_ = lVar4 + 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x80);
    local_360._M_impl.super__Rb_tree_header._M_header._M_right =
         local_360._M_impl.super__Rb_tree_header._M_header._M_left;
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_328,"cam0",&local_2b8,(char *)0x0);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_360,"camera.A",&local_2b8);
    local_2f0 = 0;
    local_2e8[0] = 0;
    local_2f8 = local_2e8;
    gutil::Properties::getString((char *)&local_328,(string *)0x128c65,(char *)&local_2f8);
    gutil::Properties::putString((char *)&local_360,(string *)"camera.width");
    gutil::Properties::getString((char *)&local_328,(string *)0x128c72,(char *)&local_2f8);
    gutil::Properties::putString((char *)&local_360,(string *)"camera.height");
    gutil::Properties::putValue<double>((Properties *)&local_360,"f",(double *)&local_2b8);
    gutil::Properties::getValue<double>((Properties *)&local_328,"baseline",&local_378,(char *)0x0);
    gutil::Properties::putValue<double>((Properties *)&local_360,"t",&local_378);
    local_248 = (code *)local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"[1 0 0; 0 1 0; 0 0 1]","")
    ;
    gutil::Properties::putString((char *)&local_360,(string *)"camera.R");
    if (local_248 != (code *)local_238) {
      operator_delete(local_248);
    }
    gutil::Properties::putValue<char[8]>
              ((Properties *)&local_360,"camera.T",(char (*) [8])"[0 0 0]");
    gutil::Properties::getValue<double>((Properties *)&local_328,"doffs",&local_368,"0");
    gutil::Properties::getValue<double>((Properties *)&local_328,"vmin",&local_370,"0");
    gutil::Properties::getValue<double>((Properties *)&local_328,"vmax",&local_330,"0");
    if ((0.0 < local_370) && (0.0 < local_330)) {
      local_248 = (code *)((local_2b8.v[0][0] * local_378) / (local_330 + local_368));
      gutil::Properties::putValue<double>
                ((Properties *)&local_360,"camera.zmin",(double *)&local_248);
      local_248 = (code *)((local_2b8.v[0][0] * local_378) / (local_370 + local_368));
      gutil::Properties::putValue<double>
                ((Properties *)&local_360,"camera.zmax",(double *)&local_248);
    }
    local_248 = (code *)local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"cam0, cam1","");
    gutil::Properties::putString((char *)&local_360,(string *)"camera.match");
    if (local_248 != (code *)local_238) {
      operator_delete(local_248);
    }
    gmath::PinholeCamera::PinholeCamera((PinholeCamera *)&local_248,(Properties *)&local_360,-1);
    local_130 = (undefined1  [8])ap_Stack_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"cam0","");
    std::__cxx11::string::_M_assign(local_240);
    if (local_130 != (undefined1  [8])ap_Stack_120) {
      operator_delete((void *)local_130);
    }
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,(value_type *)&local_248);
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_328,"cam1",&local_2b8,(char *)0x0);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_360,"camera.A",&local_2b8);
    local_130 = (undefined1  [8])local_378;
    local_128 = 0.0;
    ap_Stack_120[0] = (_Base_ptr)0x0;
    gutil::Properties::putValue<gmath::SVector<double,3>>
              ((Properties *)&local_360,"camera.T",(SVector<double,_3> *)local_130);
    gmath::PinholeCamera::PinholeCamera((PinholeCamera *)local_130,(Properties *)&local_360,-1);
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"cam1","");
    std::__cxx11::string::_M_assign((string *)&local_128);
    if (local_268[0] != local_258) {
      operator_delete(local_268[0]);
    }
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,(value_type *)local_130);
    local_130 = (undefined1  [8])gutil::Properties::load;
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    gmath::Camera::~Camera((Camera *)local_130);
    local_248 = gutil::Properties::load;
    if (local_138 != (long *)0x0) {
      (**(code **)(*local_138 + 8))();
    }
    gmath::Camera::~Camera((Camera *)&local_248);
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_360);
    this_00 = &local_328;
  }
  else {
    gutil::Properties::Properties((Properties *)local_130,file);
    gmath::PinholeCamera::PinholeCamera((PinholeCamera *)&local_248,(Properties *)local_130,-1);
    std::__cxx11::string::_M_assign(local_240);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,(value_type *)&local_248);
    local_248 = gutil::Properties::load;
    if (local_138 != (long *)0x0) {
      (**(code **)(*local_138 + 8))();
    }
    gmath::Camera::~Camera((Camera *)&local_248);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_130;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_00);
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0]);
  }
  return;
}

Assistant:

void CameraCollection::loadCamera(const char *file)
{
  std::string name=file;

  size_t i=name.find_last_of("/\\");

  if (i != name.npos)
  {
    name=name.substr(i+1);
  }

  if (name == "calib.txt")
  {
    // conversion of pinhole camera parameters from Middlebury format

    gutil::Properties mprop(file), prop;

    gmath::Matrix33d A;
    mprop.getValue("cam0", A);
    prop.putValue("camera.A", A);

    std::string s;
    mprop.getString("width", s, "0");
    prop.putString("camera.width", s);
    mprop.getString("height", s, "0");
    prop.putString("camera.height", s);

    prop.putValue("f", A(0, 0));

    double t;
    mprop.getValue("baseline", t);
    prop.putValue("t", t);

    prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");
    prop.putValue("camera.T", "[0 0 0]");

    double doffs, dmin, dmax;

    mprop.getValue("doffs", doffs, "0");
    mprop.getValue("vmin", dmin, "0");
    mprop.getValue("vmax", dmax, "0");

    if (dmin > 0 && dmax > 0)
    {
      prop.putValue("camera.zmin", A(0, 0)*t/(dmax+doffs));
      prop.putValue("camera.zmax", A(0, 0)*t/(dmin+doffs));
    }

    prop.putString("camera.match", "cam0, cam1");

    gmath::PinholeCamera cam0(prop);
    cam0.setName("cam0");
    cl.push_back(cam0);

    mprop.getValue("cam1", A);
    prop.putValue("camera.A", A);
    prop.putValue("camera.T", gmath::Vector3d(t, 0, 0));

    gmath::PinholeCamera cam1(prop);
    cam1.setName("cam1");
    cl.push_back(cam1);
  }
  else
  {
    // load text file as pinhole camera and store in list

    gutil::Properties prop(file);
    gmath::PinholeCamera cam(prop);
    cam.setName(name);

    // add camera model

    cl.push_back(cam);
  }
}